

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsPrivateGetProperty(JsValueRef object,JsValueRef key,JsValueRef *value)

{
  anon_class_24_3_7b6702ba fn;
  JsErrorCode JVar1;
  JsValueRef **in_stack_ffffffffffffffc0;
  JsValueRef *local_20;
  JsValueRef *value_local;
  JsValueRef key_local;
  JsValueRef object_local;
  
  fn.object = &local_20;
  fn.key = &key_local;
  fn.value = in_stack_ffffffffffffffc0;
  local_20 = value;
  value_local = (JsValueRef *)key;
  key_local = object;
  JVar1 = ContextAPIWrapper<false,JsPrivateGetProperty::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsPrivateGetProperty(
    _In_ JsValueRef object,
    _In_ JsValueRef key,
    _Out_ JsValueRef *value)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTGetIndex, key, object);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_REFERENCE(key, scriptContext);
        PARAM_NOT_NULL(value);
        *value = nullptr;
        Js::DynamicObject* dynObj = Js::VarTo<Js::DynamicObject>(object);

        if (!dynObj->HasObjectArray())
        {
            *value = scriptContext->GetLibrary()->GetUndefined();
            PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, value);
            return JsNoError;
        }
        *value = (JsValueRef)Js::JavascriptOperators::OP_GetElementI(dynObj->GetObjectArray(), key, scriptContext);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, value);

        return JsNoError;
    });
}